

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<capnp::_::BuilderArena::MultiSegmentState>::disposeImpl
          (HeapDisposer<capnp::_::BuilderArena::MultiSegmentState> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    capnp::_::BuilderArena::MultiSegmentState::~MultiSegmentState((MultiSegmentState *)pointer);
  }
  operator_delete(pointer,0x40);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }